

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O2

int __thiscall duckdb::ByteBuffer::read<int>(ByteBuffer *this)

{
  int iVar1;
  
  available(this,4);
  iVar1 = *(int *)this->ptr;
  this->len = this->len - 4;
  this->ptr = (data_ptr_t)((long)this->ptr + 4);
  return iVar1;
}

Assistant:

T read() {
		available(sizeof(T));
		return unsafe_read<T>();
	}